

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_f2a380::HandleTouchImpl
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,bool create,cmExecutionStatus *status)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  string *psVar4;
  Status SVar5;
  long *plVar6;
  size_type *psVar7;
  pointer pbVar8;
  bool bVar9;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string tfile;
  string e;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 *local_b0;
  undefined8 local_a8;
  size_type local_a0;
  pointer local_98;
  undefined8 local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_50;
  
  pbVar8 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)((long)pbVar1 - (long)pbVar8) < 0x21) {
    __assert_fail("args.size() > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmFileCommand.cxx"
                  ,0x38b,
                  "bool (anonymous namespace)::HandleTouchImpl(const std::vector<std::string> &, bool, cmExecutionStatus &)"
                 );
  }
  pbVar8 = pbVar8 + 1;
  bVar9 = pbVar8 == pbVar1;
  if (!bVar9) {
    do {
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      pcVar2 = (pbVar8->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,pcVar2,pcVar2 + pbVar8->_M_string_length);
      bVar3 = cmsys::SystemTools::FileIsFullPath(&local_f0);
      if (!bVar3) {
        psVar4 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
        local_d0._M_string_length = (size_type)(psVar4->_M_dataplus)._M_p;
        local_d0._M_dataplus._M_p = (pointer)psVar4->_M_string_length;
        local_d0.field_2._M_allocated_capacity = 0;
        local_88._M_dataplus._M_p = (pointer)0x0;
        local_88._M_string_length = 1;
        local_b0 = (undefined1 *)((long)&local_88.field_2 + 8);
        local_88.field_2._M_local_buf[8] = '/';
        local_d0.field_2._8_8_ = 1;
        local_a8 = 0;
        local_98 = (pbVar8->_M_dataplus)._M_p;
        local_a0 = pbVar8->_M_string_length;
        local_90 = 0;
        views._M_len = 3;
        views._M_array = (iterator)&local_d0;
        local_88.field_2._M_allocated_capacity = (size_type)local_b0;
        cmCatViews(&local_50,views);
        std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      bVar3 = cmMakefile::CanIWriteThisFile(status->Makefile,&local_f0);
      if (!bVar3) {
        std::operator+(&local_88,"attempted to touch a file: ",&local_f0);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_88);
        psVar7 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_d0.field_2._M_allocated_capacity = *psVar7;
          local_d0.field_2._8_8_ = plVar6[3];
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        }
        else {
          local_d0.field_2._M_allocated_capacity = *psVar7;
          local_d0._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_d0._M_string_length = plVar6[1];
        *plVar6 = (long)psVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,
                          (ulong)(local_88.field_2._M_allocated_capacity + 1));
        }
        std::__cxx11::string::_M_assign((string *)&status->Error);
        cmSystemTools::s_FatalErrorOccurred = true;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p == &local_d0.field_2) goto LAB_0035fd0d;
LAB_0035fd00:
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
LAB_0035fd0d:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p == &local_f0.field_2) {
          return bVar9;
        }
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        return bVar9;
      }
      SVar5 = cmsys::SystemTools::Touch(&local_f0,create);
      if (SVar5.Kind_ != Success) {
        std::operator+(&local_d0,"problem touching file: ",&local_f0);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p == &local_d0.field_2) goto LAB_0035fd0d;
        goto LAB_0035fd00;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      pbVar8 = pbVar8 + 1;
      bVar9 = pbVar8 == pbVar1;
    } while (!bVar9);
  }
  return bVar9;
}

Assistant:

bool HandleTouchImpl(std::vector<std::string> const& args, bool create,
                     cmExecutionStatus& status)
{
  // File command has at least one argument
  assert(args.size() > 1);

  for (std::string const& arg :
       cmMakeRange(args).advance(1)) // Get rid of subcommand
  {
    std::string tfile = arg;
    if (!cmsys::SystemTools::FileIsFullPath(tfile)) {
      tfile =
        cmStrCat(status.GetMakefile().GetCurrentSourceDirectory(), '/', arg);
    }
    if (!status.GetMakefile().CanIWriteThisFile(tfile)) {
      std::string e =
        "attempted to touch a file: " + tfile + " in a source directory.";
      status.SetError(e);
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }
    if (!cmSystemTools::Touch(tfile, create)) {
      std::string error = "problem touching file: " + tfile;
      status.SetError(error);
      return false;
    }
  }
  return true;
}